

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IndexedByLookup(Parse *pParse,SrcList_item *pFrom)

{
  byte bVar1;
  byte bVar2;
  Index *pIVar3;
  long lVar4;
  bool bVar5;
  
  if ((pFrom->pTab != (Table *)0x0) && (((pFrom->fg).field_0x1 & 2) != 0)) {
    pIVar3 = pFrom->pTab->pIndex;
    bVar5 = pIVar3 == (Index *)0x0;
    if (!bVar5) {
LAB_0019dd5c:
      lVar4 = 0;
      do {
        bVar1 = pIVar3->zName[lVar4];
        bVar2 = (pFrom->u1).zIndexedBy[lVar4];
        if (bVar1 == bVar2) {
          if ((ulong)bVar1 == 0) goto LAB_0019dd87;
        }
        else if (""[bVar1] != ""[bVar2]) goto LAB_0019dd87;
        lVar4 = lVar4 + 1;
      } while( true );
    }
LAB_0019dd99:
    sqlite3ErrorMsg(pParse,"no such index: %s",(pFrom->u1).zIndexedBy,0);
    pParse->checkSchema = '\x01';
LAB_0019ddb6:
    if (bVar5) {
      return 1;
    }
  }
  return 0;
LAB_0019dd87:
  if (bVar1 == bVar2) {
    pFrom->pIBIndex = pIVar3;
    goto LAB_0019ddb6;
  }
  pIVar3 = pIVar3->pNext;
  bVar5 = pIVar3 == (Index *)0x0;
  if (bVar5) goto LAB_0019dd99;
  goto LAB_0019dd5c;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, struct SrcList_item *pFrom){
  if( pFrom->pTab && pFrom->fg.isIndexedBy ){
    Table *pTab = pFrom->pTab;
    char *zIndexedBy = pFrom->u1.zIndexedBy;
    Index *pIdx;
    for(pIdx=pTab->pIndex; 
        pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy); 
        pIdx=pIdx->pNext
    );
    if( !pIdx ){
      sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
      pParse->checkSchema = 1;
      return SQLITE_ERROR;
    }
    pFrom->pIBIndex = pIdx;
  }
  return SQLITE_OK;
}